

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O2

bool __thiscall Diligent::SamplerDesc::operator==(SamplerDesc *this,SamplerDesc *RHS)

{
  if (((((((this->MinFilter == RHS->MinFilter) && (this->MagFilter == RHS->MagFilter)) &&
         (this->MipFilter == RHS->MipFilter)) &&
        (((this->AddressU == RHS->AddressU && (this->AddressV == RHS->AddressV)) &&
         ((this->AddressW == RHS->AddressW &&
          ((this->Flags == RHS->Flags && (this->UnnormalizedCoords == RHS->UnnormalizedCoords)))))))
        ) && (((float)this->MipLODBias == (float)RHS->MipLODBias &&
              (((!NAN((float)this->MipLODBias) && !NAN((float)RHS->MipLODBias) &&
                (this->MaxAnisotropy == RHS->MaxAnisotropy)) &&
               (this->ComparisonFunc == RHS->ComparisonFunc)))))) &&
      ((((float)this->BorderColor[0] == (float)RHS->BorderColor[0] &&
        (!NAN((float)this->BorderColor[0]) && !NAN((float)RHS->BorderColor[0]))) &&
       ((((float)this->BorderColor[1] == (float)RHS->BorderColor[1] &&
         ((!NAN((float)this->BorderColor[1]) && !NAN((float)RHS->BorderColor[1]) &&
          ((float)this->BorderColor[2] == (float)RHS->BorderColor[2])))) &&
        (!NAN((float)this->BorderColor[2]) && !NAN((float)RHS->BorderColor[2]))))))) &&
     (((((float)this->BorderColor[3] == (float)RHS->BorderColor[3] &&
        (!NAN((float)this->BorderColor[3]) && !NAN((float)RHS->BorderColor[3]))) &&
       (this->MinLOD == RHS->MinLOD)) && (!NAN(this->MinLOD) && !NAN(RHS->MinLOD))))) {
    return (bool)(-(RHS->MaxLOD == this->MaxLOD) & 1);
  }
  return false;
}

Assistant:

constexpr bool operator == (const SamplerDesc& RHS)const
    {
                // Ignore Name. This is consistent with the hasher (HashCombiner<HasherType, SamplerDesc>).
        return  // strcmp(Name, RHS.Name) == 0          &&
                MinFilter          == RHS.MinFilter          &&
                MagFilter          == RHS.MagFilter          &&
                MipFilter          == RHS.MipFilter          &&
                AddressU           == RHS.AddressU           &&
                AddressV           == RHS.AddressV           &&
                AddressW           == RHS.AddressW           &&
                Flags              == RHS.Flags              &&
                UnnormalizedCoords == RHS.UnnormalizedCoords &&
                MipLODBias         == RHS.MipLODBias         &&
                MaxAnisotropy      == RHS.MaxAnisotropy      &&
                ComparisonFunc     == RHS.ComparisonFunc     &&
                BorderColor[0]     == RHS.BorderColor[0]     &&
                BorderColor[1]     == RHS.BorderColor[1]     &&
                BorderColor[2]     == RHS.BorderColor[2]     &&
                BorderColor[3]     == RHS.BorderColor[3]     &&
                MinLOD             == RHS.MinLOD             &&
                MaxLOD             == RHS.MaxLOD;
    }